

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_overshoot.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::prevent_coarsen_overshoot_tmp<3,1>
          (Omega_h *this,Mesh *mesh,Real max_length,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Int IVar1;
  LO size_in;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  Read<int> local_1c8;
  Write<signed_char> local_1b8;
  Read<signed_char> local_1a8;
  undefined1 local_198 [8];
  type f;
  string local_f8 [32];
  undefined1 local_d8 [8];
  Write<signed_char> out;
  undefined1 local_c0 [4];
  LO ncands;
  Adj v2e;
  undefined1 local_80 [8];
  LOs ev2v;
  MetricEdgeLengths<3,_3> measurer;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Real max_length_local;
  Mesh *mesh_local;
  pointer local_10;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    MetricEdgeLengths<3,_1>::MetricEdgeLengths
              ((MetricEdgeLengths<3,_1> *)&ev2v.write_.shared_alloc_.direct_ptr,mesh);
    Mesh::ask_verts_of((Mesh *)local_80,(Int)mesh);
    Mesh::ask_up((Adj *)local_c0,mesh,0,1);
    if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = (pointer)((cands2edges->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (pointer)((ulong)(cands2edges->write_).shared_alloc_.alloc >> 3);
    }
    size_in = (LO)((ulong)local_10 >> 2);
    out.shared_alloc_.direct_ptr._4_4_ = size_in;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_d8,size_in,(string *)local_f8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7))
    ;
    Read<int>::Read((Read<int> *)local_198,cands2edges);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,cand_codes);
    Read<int>::Read((Read<int> *)&f.cand_codes.write_.shared_alloc_.direct_ptr,(Read<int> *)local_80
                   );
    Adj::Adj((Adj *)&f.ev2v.write_.shared_alloc_.direct_ptr,(Adj *)local_c0);
    MetricEdgeLengths<3,_1>::MetricEdgeLengths
              ((MetricEdgeLengths<3,_1> *)&f.v2e.codes.write_.shared_alloc_.direct_ptr,
               (MetricEdgeLengths<3,_3> *)&ev2v.write_.shared_alloc_.direct_ptr);
    f.measurer.metrics.write_.shared_alloc_.direct_ptr = (void *)max_length;
    Write<signed_char>::Write((Write<signed_char> *)&f.max_length,(Write<signed_char> *)local_d8);
    parallel_for<Omega_h::prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (out.shared_alloc_.direct_ptr._4_4_,(type *)local_198,"prevent_coarsen_overshoot");
    Write<signed_char>::Write(&local_1b8,(Write<signed_char> *)local_d8);
    Read<signed_char>::Read(&local_1a8,&local_1b8);
    Read<int>::Read(&local_1c8,cands2edges);
    Mesh::sync_subset_array<signed_char>
              ((Mesh *)this,(Int)mesh,(Read<signed_char> *)0x1,(LOs *)&local_1a8,(char)&local_1c8,0)
    ;
    Read<int>::~Read(&local_1c8);
    Read<signed_char>::~Read(&local_1a8);
    Write<signed_char>::~Write(&local_1b8);
    prevent_coarsen_overshoot_tmp<3,1>(Omega_h::Mesh*,double,Omega_h::Read<int>,Omega_h::Read<signed_char>)
    ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)local_198);
    Write<signed_char>::~Write((Write<signed_char> *)local_d8);
    Adj::~Adj((Adj *)local_c0);
    Read<int>::~Read((Read<int> *)local_80);
    MetricEdgeLengths<3,_1>::~MetricEdgeLengths
              ((MetricEdgeLengths<3,_1> *)&ev2v.write_.shared_alloc_.direct_ptr);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == mesh_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_overshoot.cpp"
       ,0xe);
}

Assistant:

Read<I8> prevent_coarsen_overshoot_tmp(
    Mesh* mesh, Real max_length, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricEdgeLengths<mesh_dim, metric_dim> measurer(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto ncands = cands2edges.size();
  auto out = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      for (auto ve = v2e.a2ab[v_col]; ve < v2e.a2ab[v_col + 1]; ++ve) {
        auto e2 = v2e.ab2b[ve];
        if (e2 == e) continue;
        auto e2_code = v2e.codes[ve];
        auto eev_in = code_which_down(e2_code);
        auto eev_out = 1 - eev_in;
        Few<LO, 2> new_edge;
        new_edge[eev_in] = v_onto;
        new_edge[eev_out] = ev2v[e2 * 2 + eev_out];
        auto length = measurer.measure(new_edge);
        if (length >= max_length) {
          code = dont_collapse(code, eev_col);
          break;
        }
      }
    }
    out[cand] = code;
  };
  parallel_for(ncands, f, "prevent_coarsen_overshoot");
  return mesh->sync_subset_array(
      EDGE, Read<I8>(out), cands2edges, I8(DONT_COLLAPSE), 1);
}